

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

int run_test_fork_fs_events_file_parent_child(void)

{
  int iVar1;
  __pid_t child_pid;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_fs_event_t fs_event;
  uv_timer_t timer;
  
  uVar2 = uv_default_loop();
  pcVar3 = "watch_file";
  remove("watch_file");
  create_file(pcVar3);
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file_current_dir,"watch_file",0);
    if (iVar1 == 0) {
      iVar1 = uv_timer_init(uVar2,&timer);
      if (iVar1 == 0) {
        child_pid = fork();
        if (child_pid == 0) {
          puts("Running child");
          iVar1 = uv_loop_fork(uVar2);
          if (iVar1 != 0) {
            pcVar3 = "0 == uv_loop_fork(loop)";
            uVar2 = 0x243;
            goto LAB_001190b9;
          }
          iVar1 = uv_timer_start(&timer,timer_cb_touch,100,0);
          if (iVar1 != 0) {
            pcVar3 = "r == 0";
            uVar2 = 0x246;
            goto LAB_001190b9;
          }
          if (timer_cb_touch_called != 0) {
            pcVar3 = "timer_cb_touch_called == 0";
            uVar2 = 0x248;
            goto LAB_001190b9;
          }
          if (fs_event_cb_called == '\x01') {
            pcVar3 = "fs_event_cb_called == 0";
            uVar2 = 0x249;
            goto LAB_001190b9;
          }
          puts("Running loop in child ");
          uv_run(uVar2,0);
          if (timer_cb_touch_called != 1) {
            pcVar3 = "timer_cb_touch_called == 1";
            uVar2 = 0x24d;
            goto LAB_001190b9;
          }
          if (fs_event_cb_called == '\0') {
            pcVar3 = "fs_event_cb_called == 1";
            uVar2 = 0x24e;
            goto LAB_001190b9;
          }
          remove("watch_file");
          fs_event_cb_called = '\0';
          timer_cb_touch_called = 0;
          uv_run(uVar2,0);
        }
        else {
          if (child_pid == -1) {
            pcVar3 = "child_pid != -1";
            uVar2 = 0x23c;
            goto LAB_001190b9;
          }
          assert_wait_child(child_pid);
        }
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uVar2 = 600;
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x239;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x236;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x231;
  }
LAB_001190b9:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fork_fs_events_file_parent_child) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
#if defined(__sun) || defined(_AIX) || defined(__MVS__)
  /* It's not possible to implement this without additional
   * bookkeeping on SunOS. For AIX it is possible, but has to be
   * written. See https://github.com/libuv/libuv/pull/846#issuecomment-287170420
   * TODO: On z/OS, we need to open another message queue and subscribe to the
   * same events as the parent.
   */
  return 0;
#else
  /* Establishing a started fs events watcher in the parent should
     still work in the child. */
  uv_timer_t timer;
  uv_fs_event_t fs_event;
  int r;
  pid_t child_pid;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  child_pid = fork();
  ASSERT(child_pid != -1);
  if (child_pid != 0) {
    /* parent */
    assert_wait_child(child_pid);
  } else {
    /* child */
    printf("Running child\n");
    ASSERT(0 == uv_loop_fork(loop));

    r = uv_timer_start(&timer, timer_cb_touch, 100, 0);
    ASSERT(r == 0);

    ASSERT(timer_cb_touch_called == 0);
    ASSERT(fs_event_cb_called == 0);
    printf("Running loop in child \n");
    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(timer_cb_touch_called == 1);
    ASSERT(fs_event_cb_called == 1);

    /* Cleanup */
    remove("watch_file");
    fs_event_cb_called = 0;
    timer_cb_touch_called = 0;
    uv_run(loop, UV_RUN_DEFAULT); /* Flush pending closes. */
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}